

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlContext::initialize(GlContext *this,ContextSettings *requestedSettings)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  GlFunctionPointer p_Var4;
  GlFunctionPointer p_Var5;
  GlFunctionPointer p_Var6;
  GlFunctionPointer p_Var7;
  GlFunctionPointer p_Var8;
  ostream *poVar9;
  char *pcVar10;
  long in_RSI;
  long in_RDI;
  int profile;
  char *extensionString;
  uint i;
  int numExtensions;
  glGetStringiFuncType glGetStringiFunc;
  int flags;
  char *version;
  glIsEnabledFuncType glIsEnabledFunc;
  glEnableFuncType glEnableFunc;
  glGetStringFuncType glGetStringFunc;
  glGetErrorFuncType glGetErrorFunc;
  glGetIntegervFuncType glGetIntegervFunc;
  int minorVersion;
  int majorVersion;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar11;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar12;
  char *in_stack_ffffffffffffffa8;
  undefined1 local_4c [3];
  GlContext *in_stack_ffffffffffffffb8;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  uVar12 = _local_4c;
  uVar11 = _local_4c >> 0x18;
  local_10 = in_RSI;
  setActive(in_stack_ffffffffffffffb8,SUB41(uVar11,0));
  _local_4c = uVar12;
  local_14 = 0;
  local_18 = 0;
  p_Var4 = getFunction((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  p_Var5 = getFunction((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  p_Var6 = getFunction((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  p_Var7 = getFunction((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  p_Var8 = getFunction((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if ((((p_Var4 == (GlFunctionPointer)0x0) || (p_Var5 == (GlFunctionPointer)0x0)) ||
      (p_Var6 == (GlFunctionPointer)0x0)) ||
     ((p_Var7 == (GlFunctionPointer)0x0 || (p_Var8 == (GlFunctionPointer)0x0)))) {
    poVar9 = err();
    poVar9 = std::operator<<(poVar9,"Could not load necessary function to initialize OpenGL context"
                            );
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  }
  else {
    (*p_Var4)(0x821b,&local_14);
    (*p_Var4)(0x821c,&local_18);
    iVar3 = (*p_Var5)();
    if (iVar3 == 0x500) {
      *(undefined4 *)(in_RDI + 0x14) = 1;
      *(undefined4 *)(in_RDI + 0x18) = 1;
      pcVar10 = (char *)(*p_Var6)(0x1f02);
      if (pcVar10 == (char *)0x0) {
        poVar9 = err();
        poVar9 = std::operator<<(poVar9,
                                 "Unable to retrieve OpenGL version string, defaulting to 1.1");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
      else {
        bVar1 = anon_unknown.dwarf_24fcec::GlContextImpl::parseVersionString
                          (in_stack_ffffffffffffffa8,
                           (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98,
                           (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        if (((!bVar1) &&
            (bVar1 = anon_unknown.dwarf_24fcec::GlContextImpl::parseVersionString
                               (in_stack_ffffffffffffffa8,
                                (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),in_stack_ffffffffffffff98,
                                (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                )), !bVar1)) &&
           ((bVar1 = anon_unknown.dwarf_24fcec::GlContextImpl::parseVersionString
                               (in_stack_ffffffffffffffa8,
                                (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),in_stack_ffffffffffffff98,
                                (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                )), !bVar1 &&
            (bVar1 = anon_unknown.dwarf_24fcec::GlContextImpl::parseVersionString
                               (in_stack_ffffffffffffffa8,
                                (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),in_stack_ffffffffffffff98,
                                (uint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                )), !bVar1)))) {
          poVar9 = err();
          poVar9 = std::operator<<(poVar9,"Unable to parse OpenGL version string: \"");
          poVar9 = std::operator<<(poVar9,pcVar10);
          poVar9 = std::operator<<(poVar9,"\", defaulting to 1.1");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x14) = local_14;
      *(undefined4 *)(in_RDI + 0x18) = local_18;
    }
    *(undefined4 *)(in_RDI + 0x1c) = 0;
    if (2 < *(uint *)(in_RDI + 0x14)) {
      _local_4c = 0;
      (*p_Var4)(0x821e,local_4c);
      if ((_local_4c & 2) != 0) {
        *(uint *)(in_RDI + 0x1c) = *(uint *)(in_RDI + 0x1c) | 4;
      }
      if ((*(int *)(in_RDI + 0x14) == 3) && (*(int *)(in_RDI + 0x18) == 1)) {
        *(uint *)(in_RDI + 0x1c) = *(uint *)(in_RDI + 0x1c) | 1;
        p_Var5 = getFunction((char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        if (p_Var5 != (GlFunctionPointer)0x0) {
          uVar12 = 0;
          (*p_Var4)(0x821d,&stack0xffffffffffffffa4);
          for (uVar11 = 0; uVar11 < uVar12; uVar11 = uVar11 + 1) {
            pcVar10 = (char *)(*p_Var5)(0x1f03,(ulong)uVar11);
            pcVar10 = strstr(pcVar10,"GL_ARB_compatibility");
            if (pcVar10 != (char *)0x0) {
              *(uint *)(in_RDI + 0x1c) = *(uint *)(in_RDI + 0x1c) & 0xfffffffe;
              break;
            }
          }
        }
      }
      else if ((3 < *(uint *)(in_RDI + 0x14)) || (1 < *(uint *)(in_RDI + 0x18))) {
        uVar11 = 0;
        (*p_Var4)(0x9126,&stack0xffffffffffffff94);
        if ((uVar11 & 1) != 0) {
          *(uint *)(in_RDI + 0x1c) = *(uint *)(in_RDI + 0x1c) | 1;
        }
      }
    }
    if ((*(int *)(local_10 + 8) == 0) || (*(int *)(in_RDI + 0x10) == 0)) {
      *(undefined4 *)(in_RDI + 0x10) = 0;
    }
    else {
      (*p_Var7)(0x809d);
    }
    if (((*(byte *)(local_10 + 0x18) & 1) == 0) || ((*(byte *)(in_RDI + 0x20) & 1) == 0)) {
      *(undefined1 *)(in_RDI + 0x20) = 0;
    }
    else {
      (*p_Var7)(0x8db9);
      cVar2 = (*p_Var8)(0x8db9);
      if (cVar2 == '\0') {
        poVar9 = err();
        poVar9 = std::operator<<(poVar9,"Warning: Failed to enable GL_FRAMEBUFFER_SRGB");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        *(undefined1 *)(in_RDI + 0x20) = 0;
      }
    }
  }
  return;
}

Assistant:

void GlContext::initialize(const ContextSettings& requestedSettings)
{
    // Activate the context
    setActive(true);

    // Retrieve the context version number
    int majorVersion = 0;
    int minorVersion = 0;

    // Try the new way first
    glGetIntegervFuncType glGetIntegervFunc = reinterpret_cast<glGetIntegervFuncType>(getFunction("glGetIntegerv"));
    glGetErrorFuncType glGetErrorFunc = reinterpret_cast<glGetErrorFuncType>(getFunction("glGetError"));
    glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(getFunction("glGetString"));
    glEnableFuncType glEnableFunc = reinterpret_cast<glEnableFuncType>(getFunction("glEnable"));
    glIsEnabledFuncType glIsEnabledFunc = reinterpret_cast<glIsEnabledFuncType>(getFunction("glIsEnabled"));

    if (!glGetIntegervFunc || !glGetErrorFunc || !glGetStringFunc || !glEnableFunc || !glIsEnabledFunc)
    {
        err() << "Could not load necessary function to initialize OpenGL context" << std::endl;
        return;
    }

    glGetIntegervFunc(GL_MAJOR_VERSION, &majorVersion);
    glGetIntegervFunc(GL_MINOR_VERSION, &minorVersion);

    if (glGetErrorFunc() != GL_INVALID_ENUM)
    {
        m_settings.majorVersion = static_cast<unsigned int>(majorVersion);
        m_settings.minorVersion = static_cast<unsigned int>(minorVersion);
    }
    else
    {
        // Try the old way

        // If we can't get the version number, assume 1.1
        m_settings.majorVersion = 1;
        m_settings.minorVersion = 1;

        const char* version = reinterpret_cast<const char*>(glGetStringFunc(GL_VERSION));
        if (version)
        {
            // OpenGL ES Common Lite profile: The beginning of the returned string is "OpenGL ES-CL major.minor"
            // OpenGL ES Common profile:      The beginning of the returned string is "OpenGL ES-CM major.minor"
            // OpenGL ES Full profile:        The beginning of the returned string is "OpenGL ES major.minor"
            // Desktop OpenGL:                The beginning of the returned string is "major.minor"

            using GlContextImpl::parseVersionString;

            if (!parseVersionString(version, "OpenGL ES-CL ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES-CM ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES ",    m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "",              m_settings.majorVersion, m_settings.minorVersion))
            {
                err() << "Unable to parse OpenGL version string: \"" << version << "\", defaulting to 1.1" << std::endl;
            }
        }
        else
        {
            err() << "Unable to retrieve OpenGL version string, defaulting to 1.1" << std::endl;
        }
    }

    // 3.0 contexts only deprecate features, but do not remove them yet
    // 3.1 contexts remove features if ARB_compatibility is not present
    // 3.2+ contexts remove features only if a core profile is requested

    // If the context was created with wglCreateContext, it is guaranteed to be compatibility.
    // If a 3.0 context was created with wglCreateContextAttribsARB, it is guaranteed to be compatibility.
    // If a 3.1 context was created with wglCreateContextAttribsARB, the compatibility flag
    // is set only if ARB_compatibility is present
    // If a 3.2+ context was created with wglCreateContextAttribsARB, the compatibility flag
    // would have been set correctly already depending on whether ARB_create_context_profile is supported.

    // If the user requests a 3.0 context, it will be a compatibility context regardless of the requested profile.
    // If the user requests a 3.1 context and its creation was successful, the specification
    // states that it will not be a compatibility profile context regardless of the requested
    // profile unless ARB_compatibility is present.

    m_settings.attributeFlags = ContextSettings::Default;

    if (m_settings.majorVersion >= 3)
    {
        // Retrieve the context flags
        int flags = 0;
        glGetIntegervFunc(GL_CONTEXT_FLAGS, &flags);

        if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
            m_settings.attributeFlags |= ContextSettings::Debug;

        if ((m_settings.majorVersion == 3) && (m_settings.minorVersion == 1))
        {
            m_settings.attributeFlags |= ContextSettings::Core;

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(getFunction("glGetStringi"));

            if (glGetStringiFunc)
            {
                int numExtensions = 0;
                glGetIntegervFunc(GL_NUM_EXTENSIONS, &numExtensions);

                for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                {
                    const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                    if (std::strstr(extensionString, "GL_ARB_compatibility"))
                    {
                        m_settings.attributeFlags &= ~static_cast<Uint32>(ContextSettings::Core);
                        break;
                    }
                }
            }
        }
        else if ((m_settings.majorVersion > 3) || (m_settings.minorVersion >= 2))
        {
            // Retrieve the context profile
            int profile = 0;
            glGetIntegervFunc(GL_CONTEXT_PROFILE_MASK, &profile);

            if (profile & GL_CONTEXT_CORE_PROFILE_BIT)
                m_settings.attributeFlags |= ContextSettings::Core;
        }
    }

    // Enable anti-aliasing if requested by the user and supported
    if ((requestedSettings.antialiasingLevel > 0) && (m_settings.antialiasingLevel > 0))
    {
        glEnableFunc(GL_MULTISAMPLE);
    }
    else
    {
        m_settings.antialiasingLevel = 0;
    }

    // Enable sRGB if requested by the user and supported
    if (requestedSettings.sRgbCapable && m_settings.sRgbCapable)
    {
        glEnableFunc(GL_FRAMEBUFFER_SRGB);

        // Check to see if the enable was successful
        if (glIsEnabledFunc(GL_FRAMEBUFFER_SRGB) == GL_FALSE)
        {
            err() << "Warning: Failed to enable GL_FRAMEBUFFER_SRGB" << std::endl;
            m_settings.sRgbCapable = false;
        }
    }
    else
    {
        m_settings.sRgbCapable = false;
    }
}